

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

void fiobj_free_complex_object(FIOBJ o)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  undefined1 local_30 [8];
  fiobj_stack_s stack;
  FIOBJ o_local;
  
  stack.arry = (FIOBJ *)o;
  memset(local_30,0,0x20);
  do {
    pfVar2 = fiobj_type_vtable((FIOBJ)stack.arry);
    (*pfVar2->dealloc)((FIOBJ)stack.arry,fiobj_dealloc_task,local_30);
    iVar1 = fiobj_stack_pop((fiobj_stack_s *)local_30,(FIOBJ *)&stack.arry);
  } while (iVar1 == 0);
  fiobj_stack_free((fiobj_stack_s *)local_30);
  return;
}

Assistant:

void fiobj_free_complex_object(FIOBJ o) {
  fiobj_stack_s stack = FIO_ARY_INIT;
  do {
    FIOBJECT2VTBL(o)->dealloc(o, fiobj_dealloc_task, &stack);
  } while (!fiobj_stack_pop(&stack, &o));
  fiobj_stack_free(&stack);
}